

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_str_kv_test.cc
# Opt level: O0

void kv_get_key_isnull_test(void)

{
  size_t len;
  char *strbuf;
  void *key;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  long local_68;
  void *__ptr;
  void *in_stack_ffffffffffffffb0;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  memleak_start();
  __ptr = (void *)0x0;
  btree_str_kv_get_key(in_stack_ffffffffffffffb0,(void *)0x0,(size_t *)0x0);
  if (local_68 != 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
            ,0x70);
    kv_get_key_isnull_test::__test_pass = 0;
    if (local_68 != 0) {
      __assert_fail("len == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                    ,0x70,"void kv_get_key_isnull_test()");
    }
  }
  free(__ptr);
  memleak_end();
  if (kv_get_key_isnull_test::__test_pass == 0) {
    fprintf(_stderr,"%s FAILED\n","kv get key is null test");
  }
  else {
    fprintf(_stderr,"%s PASSED\n","kv get key is null test");
  }
  return;
}

Assistant:

void kv_get_key_isnull_test()
{

    TEST_INIT();
    memleak_start();

    void *key = NULL;
    char *strbuf = NULL;
    size_t len;
    btree_str_kv_get_key(&key, strbuf, &len);

    // check results
    TEST_CHK(len == 0);
    free(key);

    memleak_end();
    TEST_RESULT("kv get key is null test");
}